

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedBreakIterator::handleSafePrevious
          (RuleBasedBreakIterator *this,int32_t fromPosition)

{
  char *pcVar1;
  RBBIStateTable *pRVar2;
  long lVar3;
  int64_t iVar4;
  int iVar5;
  uint uVar6;
  int local_88;
  uint local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint local_5c;
  long local_58;
  int64_t __offset;
  RBBIStateTable *stateTable;
  int32_t result;
  UChar32 c;
  RBBIStateTableRow *row;
  uint16_t category;
  int32_t state;
  int32_t fromPosition_local;
  RuleBasedBreakIterator *this_local;
  
  pRVar2 = this->fData->fReverseTable;
  lVar3 = (long)fromPosition - (this->fText).chunkNativeStart;
  if (((lVar3 < 0) || ((this->fText).nativeIndexingLimit <= lVar3)) ||
     (0xdbff < (ushort)(this->fText).chunkContents[lVar3])) {
    utext_setNativeIndex_63(&this->fText,(long)fromPosition);
  }
  else {
    (this->fText).chunkOffset = (int32_t)lVar3;
  }
  if (this->fData != (RBBIDataWrapper *)0x0) {
    if ((this->fText).nativeIndexingLimit < (this->fText).chunkOffset) {
      local_58 = (*((this->fText).pFuncs)->mapOffsetToNative)(&this->fText);
    }
    else {
      local_58 = (this->fText).chunkNativeStart + (long)(this->fText).chunkOffset;
    }
    if (local_58 != 0) {
      if (((this->fText).chunkOffset < 1) ||
         (0xd7ff < (ushort)(this->fText).chunkContents[(this->fText).chunkOffset + -1])) {
        local_5c = utext_previous32_63(&this->fText);
      }
      else {
        iVar5 = (this->fText).chunkOffset + -1;
        (this->fText).chunkOffset = iVar5;
        local_5c = (uint)(ushort)(this->fText).chunkContents[iVar5];
      }
      stateTable._4_4_ = local_5c;
      _result = pRVar2->fTableData + pRVar2->fRowLen;
      while (stateTable._4_4_ != 0xffffffff) {
        uVar6 = (int)stateTable._4_4_ >> 5;
        if (stateTable._4_4_ < 0xd800) {
          local_6c = (uint)this->fData->fTrie->index[(int)uVar6] * 4 + (stateTable._4_4_ & 0x1f);
        }
        else {
          if (stateTable._4_4_ < 0x10000) {
            iVar5 = 0;
            if ((int)stateTable._4_4_ < 0xdc00) {
              iVar5 = 0x140;
            }
            local_70 = (uint)this->fData->fTrie->index[(int)(iVar5 + uVar6)] * 4 +
                       (stateTable._4_4_ & 0x1f);
          }
          else {
            if (stateTable._4_4_ < 0x110000) {
              if ((int)stateTable._4_4_ < this->fData->fTrie->highStart) {
                local_78 = (uint)this->fData->fTrie->index
                                 [(int)((uint)this->fData->fTrie->index
                                              [((int)stateTable._4_4_ >> 0xb) + 0x820] +
                                       (uVar6 & 0x3f))] * 4 + (stateTable._4_4_ & 0x1f);
              }
              else {
                local_78 = this->fData->fTrie->highValueIndex;
              }
              local_74 = local_78;
            }
            else {
              local_74 = this->fData->fTrie->indexLength + 0x80;
            }
            local_70 = local_74;
          }
          local_6c = local_70;
        }
        pcVar1 = _result + (ulong)(this->fData->fTrie->index[local_6c] & 0xbfff) * 2 + 8;
        _result = pRVar2->fTableData + pRVar2->fRowLen * (uint)*(ushort *)pcVar1;
        if (*(ushort *)pcVar1 == 0) break;
        if (((this->fText).chunkOffset < 1) ||
           (0xd7ff < (ushort)(this->fText).chunkContents[(this->fText).chunkOffset + -1])) {
          local_7c = utext_previous32_63(&this->fText);
        }
        else {
          iVar5 = (this->fText).chunkOffset + -1;
          (this->fText).chunkOffset = iVar5;
          local_7c = (uint)(ushort)(this->fText).chunkContents[iVar5];
        }
        stateTable._4_4_ = local_7c;
      }
      if ((this->fText).nativeIndexingLimit < (this->fText).chunkOffset) {
        iVar4 = (*((this->fText).pFuncs)->mapOffsetToNative)(&this->fText);
        local_88 = (int)iVar4;
      }
      else {
        local_88 = (int)(this->fText).chunkNativeStart + (this->fText).chunkOffset;
      }
      return local_88;
    }
  }
  return -1;
}

Assistant:

int32_t RuleBasedBreakIterator::handleSafePrevious(int32_t fromPosition) {
    int32_t             state;
    uint16_t            category        = 0;
    RBBIStateTableRow  *row;
    UChar32             c;
    int32_t             result          = 0;

    const RBBIStateTable *stateTable = fData->fReverseTable;
    UTEXT_SETNATIVEINDEX(&fText, fromPosition);
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPuts("Handle Previous   pos   char  state category");
        }
    #endif

    // if we're already at the start of the text, return DONE.
    if (fData == NULL || UTEXT_GETNATIVEINDEX(&fText)==0) {
        return BreakIterator::DONE;
    }

    //  Set the initial state for the state machine
    c = UTEXT_PREVIOUS32(&fText);
    state = START_STATE;
    row = (RBBIStateTableRow *)
            (stateTable->fTableData + (stateTable->fRowLen * state));

    // loop until we reach the start of the text or transition to state 0
    //
    for (; c != U_SENTINEL; c = UTEXT_PREVIOUS32(&fText)) {

        // look up the current character's character category, which tells us
        // which column in the state table to look at.
        // Note:  the 16 in UTRIE_GET16 refers to the size of the data being returned,
        //        not the size of the character going in, which is a UChar32.
        //
        //  And off the dictionary flag bit. For reverse iteration it is not used.
        category = UTRIE2_GET16(fData->fTrie, c);
        category &= ~0x4000;

        #ifdef RBBI_DEBUG
            if (gTrace) {
                RBBIDebugPrintf("             %4d   ", (int32_t)utext_getNativeIndex(&fText));
                if (0x20<=c && c<0x7f) {
                    RBBIDebugPrintf("\"%c\"  ", c);
                } else {
                    RBBIDebugPrintf("%5x  ", c);
                }
                RBBIDebugPrintf("%3d  %3d\n", state, category);
            }
        #endif

        // State Transition - move machine to its next state
        //
        // fNextState is a variable-length array.
        U_ASSERT(category<fData->fHeader->fCatCount);
        state = row->fNextState[category];  /*Not accessing beyond memory*/
        row = (RBBIStateTableRow *)
            (stateTable->fTableData + (stateTable->fRowLen * state));

        if (state == STOP_STATE) {
            // This is the normal exit from the lookup state machine.
            // Transistion to state zero means we have found a safe point.
            break;
        }
    }

    // The state machine is done.  Check whether it found a match...
    result = (int32_t)UTEXT_GETNATIVEINDEX(&fText);
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPrintf("result = %d\n\n", result);
        }
    #endif
    return result;
}